

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O1

VersionBitsTester * __thiscall
VersionBitsTester::Mine(VersionBitsTester *this,uint height,int32_t nTime,int32_t nVersion)

{
  pointer *pppCVar1;
  pointer ppCVar2;
  iterator __position;
  CBlockIndex *this_00;
  CBlockIndex *pCVar3;
  ulong uVar4;
  pointer ppCVar5;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar5 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3;
  if (uVar4 < height) {
    do {
      this_00 = (CBlockIndex *)operator_new(0x98);
      memset(this_00,0,0x98);
      this_00->nHeight = (int)uVar4;
      ppCVar2 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar5 == ppCVar2) {
        pCVar3 = (CBlockIndex *)0x0;
      }
      else {
        pCVar3 = ppCVar2[-1];
      }
      this_00->pprev = pCVar3;
      this_00->nTime = nTime;
      this_00->nVersion = nVersion;
      local_40 = this_00;
      CBlockIndex::BuildSkip(this_00);
      __position._M_current =
           (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>::
        _M_realloc_insert<CBlockIndex*const&>
                  ((vector<CBlockIndex*,std::allocator<CBlockIndex*>> *)&this->vpblock,__position,
                   &local_40);
      }
      else {
        *__position._M_current = local_40;
        pppCVar1 = &(this->vpblock).
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      ppCVar5 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->vpblock).
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3;
    } while (uVar4 < height);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Mine(unsigned int height, int32_t nTime, int32_t nVersion) {
        while (vpblock.size() < height) {
            CBlockIndex* pindex = new CBlockIndex();
            pindex->nHeight = vpblock.size();
            pindex->pprev = Tip();
            pindex->nTime = nTime;
            pindex->nVersion = nVersion;
            pindex->BuildSkip();
            vpblock.push_back(pindex);
        }
        return *this;
    }